

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettify.h
# Opt level: O0

size_t floaxie::print_decimal<char>(char *buffer,uint len,int k)

{
  uint uVar1;
  type tVar2;
  type tVar3;
  type tVar4;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint term_pos;
  uint left_shift_len;
  uint left_shift_dest;
  uint left_shift_src;
  uint right_offset;
  uint left_offset;
  uint actual_dot_pos;
  int dot_pos;
  int k_local;
  uint len_local;
  char *buffer_local;
  
  uVar1 = len + k;
  if ((int)uVar1 < 1) {
    local_3c = 1;
    local_40 = 2 - uVar1;
  }
  else {
    local_40 = 0;
    local_3c = uVar1;
  }
  tVar2 = positive_part<int>(k);
  tVar3 = positive_part<int>(uVar1);
  if ((int)uVar1 < 1) {
    local_44 = local_40;
  }
  else {
    local_44 = tVar3 + (k < 0);
  }
  tVar4 = positive_part<int>(len - tVar3);
  uVar1 = len + tVar2 + (local_44 - tVar3);
  wrap::memmove<char>(buffer + local_44,buffer + tVar3,(ulong)tVar4);
  wrap::memset<char>(buffer,'0',(ulong)local_40);
  wrap::memset<char>(buffer + len,'0',(ulong)tVar2);
  buffer[local_3c] = '.';
  buffer[uVar1] = '\0';
  return (ulong)uVar1;
}

Assistant:

inline std::size_t print_decimal(CharType* buffer, const unsigned int len, const int k) noexcept
	{
		const int dot_pos = static_cast<int>(len) + k;

		const unsigned int actual_dot_pos = dot_pos > 0 ? uint32_t(dot_pos) : 1;

		const unsigned int left_offset = dot_pos > 0 ? 0 : 2 - uint32_t(dot_pos);
		const unsigned int right_offset = positive_part(k);

		const unsigned int left_shift_src = positive_part(dot_pos);
		const unsigned int left_shift_dest = dot_pos > 0 ? left_shift_src + (k < 0) : left_offset;
		const unsigned int left_shift_len = positive_part(static_cast<int>(len) - static_cast<int>(left_shift_src));

		const unsigned int term_pos = len + right_offset + (left_shift_dest - left_shift_src);

		wrap::memmove(buffer + left_shift_dest, buffer + left_shift_src, left_shift_len);
		wrap::memset(buffer, CharType('0'), left_offset);
		wrap::memset(buffer + len, CharType('0'), right_offset);
		buffer[actual_dot_pos] = '.';
		buffer[term_pos] = '\0';

		return term_pos;
	}